

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

bool __thiscall
FadBinaryMul<FadCst<int>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>::hasFastAccess
          (FadBinaryMul<FadCst<int>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_> *this)

{
  bool bVar1;
  
  bVar1 = FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::hasFastAccess
                    ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)0x15c8bc2);
  return bVar1;
}

Assistant:

bool hasFastAccess() const { return right_.hasFastAccess();}